

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O3

void __thiscall
Fl_Xlib_Graphics_Driver::draw
          (Fl_Xlib_Graphics_Driver *this,Fl_RGB_Image *img,int XP,int YP,int WP,int HP,int cx,int cy
          )

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  bool bVar7;
  int h;
  int w;
  Fl_Xlib_Graphics_Driver *pFVar8;
  Fl_RGB_Image *pFVar9;
  char cVar10;
  uint uVar11;
  int iVar12;
  Fl_Surface_Device *pFVar13;
  Fl_Display_Device *pFVar14;
  uint uVar15;
  uchar *puVar16;
  Fl_Xlib_Graphics_Driver *pFVar17;
  int iVar18;
  int iVar19;
  byte *pbVar20;
  int iVar21;
  Window WVar22;
  int Y;
  int H;
  int X;
  int W;
  uint local_50;
  uint local_4c;
  Fl_Xlib_Graphics_Driver *local_48;
  Fl_RGB_Image *local_40;
  int ny;
  int nx;
  
  if (((img->super_Fl_Image).d_ == 0) || (img->array == (uchar *)0x0)) {
    Fl_Image::draw_empty(&img->super_Fl_Image,XP,YP);
    return;
  }
  local_50 = cy;
  iVar19 = (img->super_Fl_Image).w_;
  local_4c = (img->super_Fl_Image).h_;
  local_48 = this;
  local_40 = img;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2b])
            (fl_graphics_driver,(ulong)(uint)XP,(ulong)(uint)YP,WP,HP,&X,&Y,&W,&H);
  pFVar9 = local_40;
  iVar18 = (X - XP) + cx;
  if (iVar18 < 0) {
    W = W + iVar18;
    X = X - iVar18;
    iVar18 = 0;
  }
  if (iVar19 < W + iVar18) {
    W = iVar19 - iVar18;
  }
  if (W < 1) {
    return;
  }
  iVar19 = (Y - YP) + local_50;
  if (iVar19 < 0) {
    H = H + iVar19;
    Y = Y - iVar19;
    iVar19 = 0;
  }
  if ((int)local_4c < H + iVar19) {
    H = local_4c - iVar19;
  }
  if (H < 1) {
    return;
  }
  if (local_40->id_ == 0) {
    iVar21 = (local_40->super_Fl_Image).d_;
    if (iVar21 == 1) {
LAB_001b871b:
      uVar11 = XCreatePixmap(fl_display,
                             *(undefined8 *)
                              (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),
                             (local_40->super_Fl_Image).w_,(local_40->super_Fl_Image).h_,
                             fl_visual->depth);
      pFVar9->id_ = uVar11;
      WVar22 = fl_window;
      fl_window = (Window)uVar11;
      pFVar13 = Fl_Surface_Device::_surface;
      if (Fl_Surface_Device::_surface == (Fl_Surface_Device *)0x0) {
        pFVar13 = Fl_Surface_Device::default_surface();
      }
      pFVar14 = Fl_Display_Device::display_device();
      (*(pFVar14->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar14);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2d])();
      puVar16 = pFVar9->array;
      uVar15 = (pFVar9->super_Fl_Image).w_;
      uVar6 = (pFVar9->super_Fl_Image).h_;
      uVar11 = (pFVar9->super_Fl_Image).d_;
LAB_001b8865:
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
                (fl_graphics_driver,puVar16,0,0,(ulong)uVar15,(ulong)uVar6,(ulong)uVar11,
                 (ulong)(uint)(pFVar9->super_Fl_Image).ld_);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
      fl_window = WVar22;
      (*(pFVar13->super_Fl_Device)._vptr_Fl_Device[3])(pFVar13);
    }
    else {
      if (iVar21 != 4) {
        if (iVar21 != 3) goto LAB_001b89f0;
        goto LAB_001b871b;
      }
      cVar10 = fl_can_do_alpha_blending();
      if (cVar10 != '\0') {
        uVar11 = XCreatePixmap(fl_display,
                               *(undefined8 *)
                                (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),
                               (pFVar9->super_Fl_Image).w_,(pFVar9->super_Fl_Image).h_,0x20);
        pFVar9->id_ = uVar11;
        WVar22 = fl_window;
        fl_window = (Window)uVar11;
        pFVar13 = Fl_Surface_Device::_surface;
        if (Fl_Surface_Device::_surface == (Fl_Surface_Device *)0x0) {
          pFVar13 = Fl_Surface_Device::default_surface();
        }
        pFVar14 = Fl_Display_Device::display_device();
        (*(pFVar14->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])(pFVar14);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2d])();
        puVar16 = pFVar9->array;
        uVar15 = (pFVar9->super_Fl_Image).w_;
        uVar11 = (pFVar9->super_Fl_Image).d_ | 0x40000000;
        uVar6 = (pFVar9->super_Fl_Image).h_;
        goto LAB_001b8865;
      }
    }
    if (pFVar9->id_ == 0) {
LAB_001b89f0:
      w = W;
      h = H;
      local_4c = X;
      local_50 = Y;
      iVar21 = (pFVar9->super_Fl_Image).ld_;
      if (iVar21 == 0) {
        iVar12 = (pFVar9->super_Fl_Image).d_;
        iVar21 = (pFVar9->super_Fl_Image).w_ * iVar12;
      }
      else {
        iVar12 = (pFVar9->super_Fl_Image).d_;
      }
      pbVar20 = pFVar9->array + (long)(iVar18 * iVar12) + (long)(iVar19 * iVar21);
      iVar21 = iVar21 - iVar12 * W;
      local_48 = (Fl_Xlib_Graphics_Driver *)operator_new__((long)(W * H * 3));
      fl_read_image((uchar *)local_48,local_4c,local_50,w,h,0);
      pFVar8 = local_48;
      if ((pFVar9->super_Fl_Image).d_ == 2) {
        if (0 < h) {
          pFVar17 = local_48;
          iVar19 = h;
          do {
            uVar11 = w + 1;
            if (0 < w) {
              do {
                bVar2 = *pbVar20;
                pbVar1 = pbVar20 + 1;
                pbVar20 = pbVar20 + 2;
                iVar18 = (uint)bVar2 * (uint)*pbVar1;
                uVar15 = *pbVar1 ^ 0xff;
                *(byte *)pFVar17 = (byte)(*(byte *)pFVar17 * uVar15 + iVar18 >> 8);
                *(byte *)((long)pFVar17 + 1) =
                     (byte)(*(byte *)((long)pFVar17 + 1) * uVar15 + iVar18 >> 8);
                *(byte *)((long)pFVar17 + 2) =
                     (byte)(uVar15 * *(byte *)((long)pFVar17 + 2) + iVar18 >> 8);
                pFVar17 = (Fl_Xlib_Graphics_Driver *)((long)pFVar17 + 3);
                uVar11 = uVar11 - 1;
              } while (1 < uVar11);
            }
            pbVar20 = pbVar20 + iVar21;
            bVar7 = 1 < iVar19;
            iVar19 = iVar19 + -1;
          } while (bVar7);
        }
      }
      else if (0 < h) {
        pFVar17 = local_48;
        iVar19 = h;
        do {
          uVar11 = w + 1;
          if (0 < w) {
            do {
              bVar2 = *pbVar20;
              bVar3 = pbVar20[1];
              bVar4 = pbVar20[2];
              bVar5 = pbVar20[3];
              pbVar20 = pbVar20 + 4;
              uVar15 = bVar5 ^ 0xff;
              *(byte *)pFVar17 = (byte)(*(byte *)pFVar17 * uVar15 + (uint)bVar2 * (uint)bVar5 >> 8);
              *(byte *)((long)pFVar17 + 1) =
                   (byte)(*(byte *)((long)pFVar17 + 1) * uVar15 + (uint)bVar3 * (uint)bVar5 >> 8);
              *(byte *)((long)pFVar17 + 2) =
                   (byte)(uVar15 * *(byte *)((long)pFVar17 + 2) + (uint)bVar4 * (uint)bVar5 >> 8);
              pFVar17 = (Fl_Xlib_Graphics_Driver *)((long)pFVar17 + 3);
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
          }
          pbVar20 = pbVar20 + iVar21;
          bVar7 = 1 < iVar19;
          iVar19 = iVar19 + -1;
        } while (bVar7);
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
                (fl_graphics_driver,local_48,(ulong)local_4c,(ulong)local_50,(ulong)(uint)w,
                 (ulong)(uint)h,3,0);
      operator_delete__(pFVar8);
      return;
    }
  }
  if (pFVar9->mask_ != 0) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2b])
              (fl_graphics_driver,(ulong)(uint)X,(ulong)(uint)Y,(ulong)(uint)W,(ulong)(uint)H,&nx,
               &ny,&W,&H);
    iVar18 = (nx - X) + iVar18;
    X = nx;
    iVar19 = (ny - Y) + iVar19;
    Y = ny;
    XSetClipMask(fl_display,fl_gc,pFVar9->mask_);
    XSetClipOrigin(fl_display,fl_gc,X - iVar18,Y - iVar19);
  }
  if ((pFVar9->super_Fl_Image).d_ == 4) {
    cVar10 = fl_can_do_alpha_blending();
    uVar11 = pFVar9->id_;
    if (cVar10 != '\0') {
      copy_offscreen_with_alpha(local_48,X,Y,W,H,(ulong)uVar11,iVar18,iVar19);
      goto LAB_001b89b1;
    }
  }
  else {
    uVar11 = pFVar9->id_;
  }
  copy_offscreen(local_48,X,Y,W,H,(ulong)uVar11,iVar18,iVar19);
LAB_001b89b1:
  if (pFVar9->mask_ != 0) {
    XSetClipOrigin(fl_display,fl_gc,0,0);
    Fl_Graphics_Driver::restore_clip(fl_graphics_driver);
  }
  return;
}

Assistant:

void Fl_Xlib_Graphics_Driver::draw(Fl_RGB_Image *img, int XP, int YP, int WP, int HP, int cx, int cy) {
  int X, Y, W, H;
  // Don't draw an empty image...
  if (!img->d() || !img->array) {
    img->draw_empty(XP, YP);
    return;
  }
  if (start(img, XP, YP, WP, HP, img->w(), img->h(), cx, cy, X, Y, W, H)) {
    return;
  }
  if (!img->id_) {
    if (img->d() == 1 || img->d() == 3) {
      img->id_ = fl_create_offscreen(img->w(), img->h());
      fl_begin_offscreen((Fl_Offscreen)img->id_);
      fl_draw_image(img->array, 0, 0, img->w(), img->h(), img->d(), img->ld());
      fl_end_offscreen();
    } else if (img->d() == 4 && fl_can_do_alpha_blending()) {
      img->id_ = fl_create_offscreen_with_alpha(img->w(), img->h());
      fl_begin_offscreen((Fl_Offscreen)img->id_);
      fl_draw_image(img->array, 0, 0, img->w(), img->h(), img->d() | FL_IMAGE_WITH_ALPHA,
                    img->ld());
      fl_end_offscreen();
    }
  }
  if (img->id_) {
    if (img->mask_) {
      // I can't figure out how to combine a mask with existing region,
      // so cut the image down to a clipped rectangle:
      int nx, ny; fl_clip_box(X,Y,W,H,nx,ny,W,H);
      cx += nx-X; X = nx;
      cy += ny-Y; Y = ny;
      // make X use the bitmap as a mask:
      XSetClipMask(fl_display, fl_gc, img->mask_);
      int ox = X-cx; if (ox < 0) ox += img->w();
      int oy = Y-cy; if (oy < 0) oy += img->h();
      XSetClipOrigin(fl_display, fl_gc, X-cx, Y-cy);
    }

    if (img->d() == 4 && fl_can_do_alpha_blending())
      copy_offscreen_with_alpha(X, Y, W, H, img->id_, cx, cy);
    else
      copy_offscreen(X, Y, W, H, img->id_, cx, cy);

    if (img->mask_) {
      // put the old clip region back
      XSetClipOrigin(fl_display, fl_gc, 0, 0);
      fl_restore_clip();
    }
  } else {
    // Composite image with alpha manually each time...
    alpha_blend(img, X, Y, W, H, cx, cy);
  }
}